

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::
FormatString<char[32],unsigned_int,char[8],char_const*,char[12],unsigned_int,char,char_const*,char[8]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [32],uint *Args_1,
          char (*Args_2) [8],char **Args_3,char (*Args_4) [12],uint *Args_5,char *Args_6,
          char **Args_7,char (*Args_8) [8])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[32],unsigned_int,char[8],char_const*,char[12],unsigned_int,char,char_const*,char[8]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [32])this,(uint *)Args,(char (*) [8])Args_1,(char **)Args_2,
             (char (*) [12])Args_3,(uint *)Args_4,(char *)Args_5,(char **)Args_6,
             (char (*) [8])Args_7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}